

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O2

bool units::cleanUnitString(string *unit_string,uint64_t match_flags)

{
  byte *pbVar1;
  _Iter_negate<units::cleanSpaces(std::__cxx11::string&,bool)::__0> _Var2;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Var3;
  char cVar4;
  byte bVar5;
  uint uVar6;
  int iVar7;
  uint uVar8;
  ulong uVar9;
  ulong uVar10;
  undefined8 uVar11;
  ulong uVar12;
  ulong uVar13;
  difference_type dVar14;
  long lVar15;
  undefined7 extraout_var;
  const_iterator cVar16;
  char *pcVar17;
  size_t sVar18;
  pointer pcVar19;
  char *pcVar20;
  char *pcVar21;
  char *pcVar22;
  char cVar23;
  char extraout_DL;
  char cVar24;
  size_type sVar25;
  undefined8 extraout_RDX;
  size_t sVar26;
  size_t sz;
  ulong uVar27;
  pointer pcVar28;
  bool bVar29;
  long lVar30;
  undefined1 *__it;
  char cVar31;
  size_t *in_R9;
  size_type sVar32;
  pointer pcVar33;
  byte bVar34;
  _Iter_negate<units::cleanSpaces(std::__cxx11::string&,bool)::__0> *this;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Var35;
  bool bVar36;
  bool bVar37;
  bool bVar38;
  double dVar39;
  precise_unit pVar40;
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  char *pcStackY_5d0;
  allocator local_5b5;
  uint local_5b4;
  ulong local_5b0;
  uint64_t local_5a8;
  undefined1 local_599;
  ulong local_598;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_590;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_588;
  size_t reploc;
  size_type local_578;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> str;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_530;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_4f0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_4b0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_470;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_430;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_3f0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_3b0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_370;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_330;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_2f0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_2b0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_270;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_230;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1f0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1b0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_170;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_130;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_f0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_b0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_70;
  
  local_578 = unit_string->_M_string_length;
  local_5a8 = match_flags;
  if ((cleanUnitString(std::__cxx11::string&,unsigned_long)::spchar_abi_cxx11_ == '\0') &&
     (iVar7 = __cxa_guard_acquire(&cleanUnitString(std::__cxx11::string&,unsigned_long)::
                                   spchar_abi_cxx11_), iVar7 != 0)) {
    std::__cxx11::string::string((string *)&str," \t\n\r",(allocator *)&reploc);
    std::operator+(&cleanUnitString(std::__cxx11::string&,unsigned_long)::spchar_abi_cxx11_,&str,
                   '\0');
    std::__cxx11::string::~string((string *)&str);
    __cxa_atexit(std::__cxx11::string::~string,
                 &cleanUnitString(std::__cxx11::string&,unsigned_long)::spchar_abi_cxx11_,
                 &__dso_handle);
    __cxa_guard_release(&cleanUnitString(std::__cxx11::string&,unsigned_long)::spchar_abi_cxx11_);
    match_flags = local_5a8;
  }
  uVar10 = 0;
  uVar6 = (byte)(unit_string->_M_dataplus)._M_p[unit_string->_M_string_length - 1] - 0x2a;
  if ((uVar6 < 0x35) && ((0x10000000000021U >> ((ulong)uVar6 & 0x3f) & 1) != 0)) {
    std::__cxx11::string::pop_back();
    uVar10 = 1;
  }
  uVar9 = std::__cxx11::string::find_first_not_of((string *)unit_string,0x19fc78);
  if (uVar9 != 0) {
    if (uVar9 == 0xffffffffffffffff) {
      unit_string->_M_string_length = 0;
      *(unit_string->_M_dataplus)._M_p = '\0';
      return true;
    }
    std::__cxx11::string::erase((ulong)unit_string,0);
    uVar9 = std::__cxx11::string::find_first_not_of((string *)unit_string,0x19fc78);
    uVar10 = 1;
  }
  pcVar19 = (unit_string->_M_dataplus)._M_p;
  bVar36 = pcVar19[uVar9] == '/';
  local_5b4 = (uint)CONCAT71((int7)((ulong)pcVar19 >> 8),bVar36);
  if (bVar36) {
    std::__cxx11::string::insert((ulong)unit_string,uVar9,'\x01');
    uVar10 = 1;
  }
  cVar31 = (char)unit_string;
  if ((match_flags >> 0x24 & 1) == 0) {
    pcVar19 = (unit_string->_M_dataplus)._M_p;
    sVar25 = unit_string->_M_string_length;
    pcVar17 = pcVar19 + sVar25;
    pcVar20 = pcVar19 + 1;
    for (lVar30 = (long)sVar25 >> 2; 0 < lVar30; lVar30 = lVar30 + -1) {
      if (pcVar20[-1] < '\0') {
        pcVar20 = pcVar20 + -1;
        goto LAB_0014f0c1;
      }
      if (*pcVar20 < '\0') goto LAB_0014f0c1;
      if (pcVar20[1] < '\0') {
        pcVar20 = pcVar20 + 1;
        goto LAB_0014f0c1;
      }
      if (pcVar20[2] < '\0') {
        pcVar20 = pcVar20 + 2;
        goto LAB_0014f0c1;
      }
      pcVar20 = pcVar20 + 4;
      sVar25 = sVar25 - 4;
    }
    pcVar22 = pcVar20 + -1;
    if (sVar25 == 1) {
LAB_0014fd83:
      pcVar20 = pcVar22;
      if (-1 < *pcVar22) {
        pcVar20 = pcVar17;
      }
LAB_0014f0c1:
      if (pcVar20 != pcVar17) {
        local_5b0 = CONCAT44(local_5b0._4_4_,(int)uVar10);
        uVar11 = 0;
        for (lVar30 = 0; lVar30 != 0x420; lVar30 = lVar30 + 0x10) {
          pcVar17 = *(char **)((long)&unicodeReplacement(std::__cxx11::string&)::ucodeReplacements +
                              lVar30);
          while (uVar10 = std::__cxx11::string::find((char *)unit_string,(ulong)pcVar17),
                uVar10 != 0xffffffffffffffff) {
            pcVar20 = (char *)strlen(pcVar17);
            if ((uVar10 == 0 || pcVar20 != (char *)0x1) ||
               ((byte)(unit_string->_M_dataplus)._M_p[uVar10 - 1] < 0xc1)) {
              pcVar22 = *(char **)((long)&DAT_00198240 + lVar30);
              std::__cxx11::string::replace((ulong)unit_string,uVar10,pcVar20);
              if ((uVar10 != 0) && ((unit_string->_M_dataplus)._M_p[uVar10 - 1] == '\\')) {
                std::__cxx11::string::erase((ulong)unit_string,uVar10 - 1);
              }
              strlen(pcVar22);
              uVar11 = CONCAT71((int7)((ulong)pcVar22 >> 8),1);
            }
          }
        }
        uVar10 = CONCAT71((int7)((ulong)uVar11 >> 8),(byte)uVar11 | (byte)local_5b0) & 0xffffffff;
      }
    }
    else {
      if (sVar25 == 3) {
        pcVar21 = pcVar20;
        pcVar20 = pcVar22;
        if (-1 < *pcVar22) goto LAB_0014fd74;
        goto LAB_0014f0c1;
      }
      pcVar21 = pcVar22;
      if (sVar25 == 2) {
LAB_0014fd74:
        pcVar20 = pcVar21;
        if (-1 < *pcVar21) {
          pcVar22 = pcVar21 + 1;
          goto LAB_0014fd83;
        }
        goto LAB_0014f0c1;
      }
    }
    for (lVar30 = 0; lVar30 != 0x40; lVar30 = lVar30 + 0x10) {
      pcVar17 = *(char **)((long)&cleanUnitString::earlyCodeReplacements._M_elems[0].first + lVar30)
      ;
      uVar9 = std::__cxx11::string::find((char *)unit_string,(ulong)pcVar17);
      while (uVar9 != 0xffffffffffffffff) {
        pcVar20 = (char *)strlen(pcVar17);
        std::__cxx11::string::replace((ulong)unit_string,uVar9,pcVar20);
        uVar9 = std::__cxx11::string::find((char *)unit_string,(ulong)pcVar17);
        uVar10 = CONCAT71((int7)(uVar10 >> 8),1);
      }
    }
    lVar30 = std::__cxx11::string::find_first_of((string *)unit_string,0x19fc78);
    if (lVar30 != -1) {
      local_5b0 = CONCAT44(local_5b0._4_4_,(int)uVar10);
      reploc = 0;
      iVar7 = std::__cxx11::string::compare((ulong)unit_string,0,(char *)0x4);
      if (iVar7 == 0) {
        reploc = 2;
        uVar11 = std::__cxx11::string::replace((ulong)unit_string,0,(char *)0x4);
        local_5b4 = (uint)CONCAT71((int7)((ulong)uVar11 >> 8),1);
      }
      bVar36 = ReplaceStringInPlace(unit_string," per ",5,"/",(int)&reploc,in_R9);
      local_598 = CONCAT71(local_598._1_7_,bVar36);
      if ((reploc != 0) &&
         (uVar10 = std::__cxx11::string::find(cVar31,0x28), uVar10 != 0xffffffffffffffff)) {
        uVar9 = std::__cxx11::string::find(cVar31,0x2f);
        do {
          uVar27 = uVar9 + 1;
          uVar12 = std::__cxx11::string::find(cVar31,0x2f);
          uVar9 = uVar12;
          if (uVar10 < uVar12) {
            if (uVar12 == 0xffffffffffffffff) {
              std::__cxx11::string::push_back(cVar31);
            }
            else {
              std::__cxx11::string::insert((ulong)unit_string,uVar12,'\x01');
            }
            std::__cxx11::string::insert((ulong)unit_string,uVar27,'\x01');
            uVar9 = uVar12 + 2;
          }
        } while (uVar12 != 0xffffffffffffffff);
      }
      std::__cxx11::string::find_first_not_of((char *)unit_string,0x163366);
      lVar30 = std::__cxx11::string::find_first_of((char *)unit_string,0x163366);
      auVar41 = std::__cxx11::string::find_first_of((char *)unit_string,0x1687d7);
      uVar6 = local_5b4;
      uVar11 = auVar41._8_8_;
      if (lVar30 == 2) {
        if (unit_string->_M_string_length < 5) {
          lVar30 = 2;
        }
        else {
          lVar30 = 2;
          auVar42 = std::__cxx11::string::find_first_not_of((char *)unit_string,0x163366);
          uVar11 = auVar42._8_8_;
          if (((auVar42._0_8_ != -1) && (auVar41._0_8_ == -1)) &&
             ((unit_string->_M_dataplus)._M_p[auVar42._0_8_] != '(')) {
            lVar30 = 2;
            std::__cxx11::string::substr((ulong)&str,(ulong)unit_string);
            bVar36 = std::operator!=(&str,"fl");
            if ((bVar36) &&
               (pVar40 = get_unit(&str,local_5a8),
               pVar40.base_units_ != (unit_data)0xfa94a488 || !NAN(pVar40.multiplier_))) {
              (unit_string->_M_dataplus)._M_p[2] = '_';
              pVar40 = get_unit(unit_string,local_5a8);
              if (pVar40.base_units_ == (unit_data)0xfa94a488 && NAN(pVar40.multiplier_)) {
                (unit_string->_M_dataplus)._M_p[2] = '*';
              }
              lVar30 = std::__cxx11::string::find_first_of((char *)unit_string,0x163366);
            }
            std::__cxx11::string::~string((string *)&str);
            uVar11 = extraout_RDX;
          }
        }
      }
      auVar42._8_8_ = uVar11;
      auVar42._0_8_ = lVar30;
      local_5b4 = CONCAT31((int3)(uVar6 >> 8),(byte)uVar6 | (byte)local_598);
      while( true ) {
        lVar30 = auVar42._0_8_;
        cVar23 = auVar42[8];
        if (lVar30 == -1) break;
        if (lVar30 + 2U == unit_string->_M_string_length) {
          if (auVar41._0_8_ == -1) {
            std::__cxx11::string::substr((ulong)&str,(ulong)unit_string);
            pVar40 = get_unit(&str,local_5a8);
            if ((!NAN(pVar40.multiplier_)) || (pVar40.base_units_ != (unit_data)0xfa94a488)) {
              (unit_string->_M_dataplus)._M_p[lVar30] = '_';
              pVar40 = get_unit(unit_string,local_5a8);
              if (pVar40.base_units_ == (unit_data)0xfa94a488 && NAN(pVar40.multiplier_)) {
                (unit_string->_M_dataplus)._M_p[lVar30] = '*';
              }
              std::__cxx11::string::~string((string *)&str);
              break;
            }
            std::__cxx11::string::~string((string *)&str);
            cVar23 = extraout_DL;
          }
          shortStringReplacement_abi_cxx11_
                    (&str,(units *)(ulong)(uint)(int)(unit_string->_M_dataplus)._M_p[lVar30 + 1],
                     cVar23);
          std::__cxx11::string::replace((ulong)unit_string,lVar30 + 1,(string *)0x1);
LAB_0014f533:
          std::__cxx11::string::~string((string *)&str);
        }
        else {
          bVar5 = (unit_string->_M_dataplus)._M_p[lVar30 + 1];
          uVar6 = bVar5 - 0x20;
          if ((uVar6 < 0x3f) && ((0x400000000000c401U >> ((ulong)uVar6 & 0x3f) & 1) != 0)) {
            shortStringReplacement_abi_cxx11_(&str,(units *)(ulong)(uint)(int)(char)bVar5,cVar23);
            std::__cxx11::string::replace((ulong)unit_string,lVar30 + 1,(string *)0x1);
            goto LAB_0014f533;
          }
        }
        auVar42 = std::__cxx11::string::find_first_of((char *)unit_string,0x163366);
      }
      do {
        uVar10 = std::__cxx11::string::find((char *)unit_string,0x161cc1);
        if (uVar10 == 0xffffffffffffffff) goto LAB_0014f5e5;
        lVar30 = std::__cxx11::string::find_first_not_of((string *)unit_string,0x19fc78);
        if ((lVar30 != -1) &&
           ((cVar23 = (unit_string->_M_dataplus)._M_p[lVar30], cVar23 == '(' || (cVar23 == '['))))
        goto LAB_0014f5e5;
      } while( true );
    }
    local_598 = 0xffffffffffffffff;
    goto LAB_0014fad6;
  }
  local_598 = std::__cxx11::string::find((char *)unit_string,0x168653);
LAB_0014fc83:
  if ((*(unit_string->_M_dataplus)._M_p == '(') &&
     (removeOuterParenthesis(unit_string), unit_string->_M_string_length == 0)) {
    return true;
  }
  if ((match_flags >> 0x24 & 1) == 0) {
    bVar36 = ReplaceStringInPlace(unit_string,"**",2,"^",(int)&str,in_R9);
    uVar10 = CONCAT71(extraout_var,bVar36 | (byte)uVar10) & 0xffffffff;
  }
  if (((uint)match_flags >> 9 & 1) != 0) {
    if ((ciConversion(std::__cxx11::string&)::ciConversions_abi_cxx11_ == '\0') &&
       (iVar7 = __cxa_guard_acquire(&ciConversion(std::__cxx11::string&)::ciConversions_abi_cxx11_),
       iVar7 != 0)) {
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::pair<const_char_(&)[2],_const_char_(&)[2],_true>
                ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&str,(char (*) [2])0x168803,(char (*) [2])0x16103f);
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::pair<const_char_(&)[2],_const_char_(&)[2],_true>
                (&local_530,(char (*) [2])0x168806,(char (*) [2])0x165298);
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::pair<const_char_(&)[2],_const_char_(&)[2],_true>
                (&local_4f0,(char (*) [2])0x1698b9,(char (*) [2])0x163fa4);
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::pair<const_char_(&)[3],_const_char_(&)[3],_true>
                (&local_4b0,(char (*) [3])"MM",(char (*) [3])0x167a7e);
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::pair<const_char_(&)[3],_const_char_(&)[3],_true>
                (&local_470,(char (*) [3])"NM",(char (*) [3])"nm");
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::pair<const_char_(&)[3],_const_char_(&)[3],_true>
                (&local_430,(char (*) [3])"ML",(char (*) [3])0x163716);
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::pair<const_char_(&)[3],_const_char_(&)[3],_true>
                (&local_3f0,(char (*) [3])0x169aa8,(char (*) [3])"Gs");
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::pair<const_char_(&)[3],_const_char_(&)[4],_true>
                (&local_3b0,(char (*) [3])"GL",(char (*) [4])"Gal");
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::pair<const_char_(&)[3],_const_char_(&)[3],_true>
                (&local_370,(char (*) [3])"MG",(char (*) [3])"mg");
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::pair<const_char_(&)[4],_const_char_(&)[4],_true>
                (&local_330,(char (*) [4])"[G]",(char (*) [4])"[g]");
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::pair<const_char_(&)[3],_const_char_(&)[3],_true>
                (&local_2f0,(char (*) [3])"PG",(char (*) [3])"pg");
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::pair<const_char_(&)[3],_const_char_(&)[3],_true>
                (&local_2b0,(char (*) [3])0x169970,(char (*) [3])0x164496);
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::pair<const_char_(&)[3],_const_char_(&)[3],_true>
                (&local_270,(char (*) [3])"UG",(char (*) [3])0x1671d3);
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::pair<const_char_(&)[3],_const_char_(&)[3],_true>
                (&local_230,(char (*) [3])0x1685ec,(char (*) [3])0x1669f6);
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::pair<const_char_(&)[3],_const_char_(&)[3],_true>
                (&local_1f0,(char (*) [3])0x164e81,(char (*) [3])0x164f47);
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::pair<const_char_(&)[4],_const_char_(&)[4],_true>
                (&local_1b0,(char (*) [4])"RAD",(char (*) [4])0x164013);
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::pair<const_char_(&)[3],_const_char_(&)[8],_true>
                (&local_170,(char (*) [3])"GB",(char (*) [8])"gilbert");
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::pair<const_char_(&)[3],_const_char_(&)[3],_true>
                (&local_130,(char (*) [3])"WB",(char (*) [3])"Wb");
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::pair<const_char_(&)[3],_const_char_(&)[3],_true>
                (&local_f0,(char (*) [3])"CP",(char (*) [3])"cP");
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::pair<const_char_(&)[3],_const_char_(&)[3],_true>
                (&local_b0,(char (*) [3])"EV",(char (*) [3])"eV");
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::pair<const_char_(&)[3],_const_char_(&)[3],_true>
                (&local_70,(char (*) [3])0x169d78,(char (*) [3])"pT");
      std::
      _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
      ::_Hashtable<std::pair<std::__cxx11::string_const,std::__cxx11::string>const*>
                ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                  *)ciConversion(std::__cxx11::string&)::ciConversions_abi_cxx11_,&str,
                 &stack0xffffffffffffffd0,0,&reploc,&local_5b5,&local_599);
      lVar30 = 0x500;
      do {
        std::
        pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~pair((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)((long)&str._M_dataplus._M_p + lVar30));
        lVar30 = lVar30 + -0x40;
      } while (lVar30 != -0x40);
      __cxa_atexit(std::
                   unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::~unordered_map,ciConversion(std::__cxx11::string&)::ciConversions_abi_cxx11_,
                   &__dso_handle);
      __cxa_guard_release(&ciConversion(std::__cxx11::string&)::ciConversions_abi_cxx11_);
      match_flags = local_5a8;
    }
    pcVar19 = (unit_string->_M_dataplus)._M_p;
    sVar25 = unit_string->_M_string_length;
    for (sVar32 = 0; sVar25 != sVar32; sVar32 = sVar32 + 1) {
      iVar7 = toupper((int)pcVar19[sVar32]);
      pcVar19[sVar32] = (char)iVar7;
    }
    cVar16 = std::
             _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
             ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                     *)ciConversion(std::__cxx11::string&)::ciConversions_abi_cxx11_,unit_string);
    if (cVar16.
        super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
        ._M_cur == (__node_type *)0x0) {
      pcVar17 = (unit_string->_M_dataplus)._M_p;
      if (*pcVar17 == 'P') {
        cVar23 = 'p';
LAB_0014fd42:
        *pcVar17 = cVar23;
        pcVar17 = (unit_string->_M_dataplus)._M_p;
      }
      else if (*pcVar17 == 'M') {
        cVar23 = 'm';
        goto LAB_0014fd42;
      }
      sVar25 = unit_string->_M_string_length;
      if (pcVar17[sVar25 - 1] == 'M') {
        if (sVar25 == 3) {
          dVar39 = getPrefixMultiplier2Char(*pcVar17,pcVar17[1]);
        }
        else {
          if (sVar25 != 2) goto LAB_0014fdaf;
          dVar39 = getPrefixMultiplier(*pcVar17);
        }
        if ((dVar39 != 0.0) || (NAN(dVar39))) {
          pcVar17[sVar25 - 1] = 'm';
        }
      }
    }
    else {
      std::__cxx11::string::_M_assign((string *)unit_string);
    }
LAB_0014fdaf:
    lVar30 = std::__cxx11::string::find((char *)unit_string,0x168802);
    if (lVar30 != -1) {
      (unit_string->_M_dataplus)._M_p[lVar30 + 1] = 's';
    }
    lVar30 = std::__cxx11::string::find((char *)unit_string,0x168805);
    uVar10 = CONCAT71((int7)(uVar10 >> 8),1);
    if (lVar30 != -1) {
      (unit_string->_M_dataplus)._M_p[lVar30 + 1] = 'g';
    }
  }
  if ((match_flags >> 0x24 & 1) == 0) {
    local_5b0 = CONCAT44(local_5b0._4_4_,(int)uVar10);
    lVar30 = std::__cxx11::string::rfind(cVar31,0x3c);
    if (lVar30 != -1) {
LAB_0014fe37:
      uVar10 = std::__cxx11::string::find((char *)unit_string,0x168808);
      if (uVar10 != 0xffffffffffffffff) {
        std::__cxx11::string::replace((ulong)unit_string,uVar10,(char *)0x5);
        uVar10 = std::__cxx11::string::find((char *)unit_string,0x16880e);
        if (uVar10 == 0xffffffffffffffff) goto LAB_0014fe78;
        pcStackY_5d0 = (char *)0x6;
        goto LAB_0014fe94;
      }
      goto LAB_0014febf;
    }
LAB_0014ff27:
    uVar10 = local_5b0 & 0xffffffff;
    for (lVar30 = 0; match_flags = local_5a8, lVar30 != 0x250; lVar30 = lVar30 + 0x10) {
      pcVar17 = *(char **)((long)&cleanUnitString::allCodeReplacements._M_elems[0].first + lVar30);
      uVar9 = std::__cxx11::string::find((char *)unit_string,(ulong)pcVar17);
      while (uVar9 != 0xffffffffffffffff) {
        pcVar20 = (char *)strlen(pcVar17);
        std::__cxx11::string::replace((ulong)unit_string,uVar9,pcVar20);
        uVar9 = std::__cxx11::string::find((char *)unit_string,(ulong)pcVar17);
        uVar10 = CONCAT71((int7)(uVar10 >> 8),1);
      }
    }
  }
  uVar9 = unit_string->_M_string_length;
  if ((1 < uVar9) &&
     (pcVar19 = (unit_string->_M_dataplus)._M_p, (pcVar19[uVar9 - 1] & 0xfeU) == 0x32)) {
    pcVar17 = pcVar19 + (uVar9 - 1);
    if (((pcVar19[uVar9 - 2] == '-') || (pcVar19[uVar9 - 2] == '+')) && (uVar9 != 2)) {
      pcVar17 = pcVar19 + (uVar9 - 2);
    }
    if (9 < (byte)(pcVar17[-1] - 0x30U)) {
      uVar6 = (byte)pcVar17[-1] - 0x2a;
      if (uVar6 < 0x3c) {
        if ((0x81000000800003aU >> ((ulong)uVar6 & 0x3f) & 1) == 0) {
          if ((ulong)uVar6 != 0) goto LAB_001507c7;
          pcVar17[-1] = '^';
        }
      }
      else {
LAB_001507c7:
        if (*pcVar17 == '+') {
          *pcVar17 = '^';
        }
        else {
          std::__cxx11::string::insert(unit_string,pcVar17,0x5e);
        }
      }
    }
  }
  if ((match_flags >> 0x24 & 1) != 0) goto LAB_001504ec;
  lVar30 = std::__cxx11::string::rfind(cVar31,0x2e);
  if ((lVar30 != -1) && (9 < (byte)((unit_string->_M_dataplus)._M_p[lVar30 + 1] - 0x30U))) {
    lVar30 = std::__cxx11::string::find(cVar31,0x2e);
    if (lVar30 != -1) {
      cVar23 = '\0';
LAB_00150058:
      cVar4 = cVar23;
      if (lVar30 == 0) {
        if ((1 < unit_string->_M_string_length) &&
           (9 < (byte)((unit_string->_M_dataplus)._M_p[1] - 0x30U))) {
          cVar4 = '\x01';
        }
        goto LAB_001500cd;
      }
      if (lVar30 == -1) goto LAB_00150166;
      pcVar19 = (unit_string->_M_dataplus)._M_p;
      if ((byte)(pcVar19[lVar30 + -1] - 0x30U) < 10) {
        cVar24 = pcVar19[lVar30 + 1];
        if ((byte)(cVar24 - 0x30U) < 10) goto LAB_001500cd;
      }
      else {
        if (pcVar19[lVar30 + -1] == '*') {
          cVar23 = '\x02';
LAB_00150166:
          local_5b0 = (ulong)(cVar23 == '\x01');
          goto LAB_00150170;
        }
        cVar24 = pcVar19[lVar30 + 1];
      }
      cVar23 = '\x02';
      if ((cVar24 == ' ') || (cVar4 = '\x01', lVar30 == unit_string->_M_string_length - 1))
      goto LAB_00150166;
LAB_001500cd:
      cVar23 = cVar4;
      lVar30 = std::__cxx11::string::find(cVar31,0x2e);
      goto LAB_00150058;
    }
    local_5b0 = 0;
LAB_00150170:
    iVar7 = 0;
    uVar10 = local_5b0;
    while( true ) {
      while( true ) {
        uVar9 = std::__cxx11::string::find(cVar31,0x2e);
        if (uVar9 != 0) break;
        if (1 < unit_string->_M_string_length) {
          pcVar17 = (unit_string->_M_dataplus)._M_p;
          if ((byte)(pcVar17[1] - 0x30U) < 10) {
            iVar7 = iVar7 + 1;
          }
          else if ((char)uVar10 == '\0') {
            while ((*pcVar17 == '.' || (*pcVar17 == ' '))) {
              std::__cxx11::string::erase((ulong)unit_string,0);
              pcVar17 = (unit_string->_M_dataplus)._M_p;
            }
          }
          else {
            *pcVar17 = '*';
          }
        }
      }
      if (uVar9 == 0xffffffffffffffff) break;
      pcVar19 = (unit_string->_M_dataplus)._M_p;
      if ((byte)(pcVar19[uVar9 - 1] - 0x30U) < 10) {
        if ((byte)(pcVar19[uVar9 + 1] - 0x30U) < 10) goto LAB_001501eb;
LAB_001501bd:
        if ((char)uVar10 == '\0') {
          while ((pcVar19[uVar9] == '.' || (uVar10 = local_5b0, pcVar19[uVar9] == ' '))) {
            std::__cxx11::string::erase((ulong)unit_string,uVar9);
            pcVar19 = (unit_string->_M_dataplus)._M_p;
          }
        }
        else {
          pcVar19[uVar9] = '*';
        }
      }
      else {
        if (pcVar19[uVar9 - 1] != '*') goto LAB_001501bd;
LAB_001501eb:
        iVar7 = iVar7 + 1;
      }
    }
    if (1 < iVar7) {
      iVar7 = 0;
      uVar10 = 0;
      do {
        lVar30 = std::__cxx11::string::find(cVar31,0x2e);
        while( true ) {
          if (lVar30 == -1) goto LAB_001502cc;
          pcVar19 = (unit_string->_M_dataplus)._M_p;
          lVar15 = lVar30;
          do {
            lVar15 = lVar15 + 1;
            if (pcVar19[lVar15] == '.') goto LAB_001502bd;
          } while ((byte)(pcVar19[lVar15] - 0x30U) < 10);
          lVar30 = std::__cxx11::string::find(cVar31,0x2e);
          pcVar19 = (unit_string->_M_dataplus)._M_p;
          if (pcVar19[lVar15] == '.') break;
          iVar7 = iVar7 + 1;
        }
LAB_001502bd:
        pcVar19[lVar15] = '*';
      } while( true );
    }
LAB_001502cc:
    if (0 < iVar7) {
      uVar10 = 0;
LAB_001502d4:
      lVar30 = std::__cxx11::string::find(cVar31,0x2e);
      if (lVar30 != -1) {
        pcVar19 = (unit_string->_M_dataplus)._M_p;
        lVar15 = lVar30;
        do {
          lVar15 = lVar15 + -1;
          if (lVar15 == 0) goto LAB_001502d4;
          bVar5 = pcVar19[lVar15];
        } while ((byte)(bVar5 - 0x30) < 10);
        if ((bVar5 | 0x20) == 0x65) {
          pcVar19[lVar30] = '*';
        }
        goto LAB_001502d4;
      }
    }
    uVar10 = CONCAT71((int7)(uVar10 >> 8),1);
    if ((((uint)local_5a8 >> 10 & 1) != 0) &&
       (lVar30 = std::__cxx11::string::rfind(cVar31,0x2f), lVar30 != -1)) {
      std::__cxx11::string::insert((ulong)unit_string,lVar30 + 1,'\x01');
      std::__cxx11::string::push_back(cVar31);
    }
  }
  while (uVar9 = std::__cxx11::string::find((char *)unit_string,0x1639e4),
        uVar9 != 0xffffffffffffffff) {
    if ((uVar9 + 2 < unit_string->_M_string_length) &&
       ((unit_string->_M_dataplus)._M_p[uVar9 + 2] == '^')) {
      std::__cxx11::string::replace((ulong)unit_string,uVar9,(char *)0x2);
    }
    else {
      std::__cxx11::string::erase((ulong)unit_string,uVar9);
    }
  }
  clearEmptySegments(unit_string);
  while (sVar18 = std::__cxx11::string::find((char *)unit_string,0x168832),
        sVar18 != 0xffffffffffffffff) {
    pcVar19 = (unit_string->_M_dataplus)._M_p;
    cVar23 = pcVar19[sVar18 + 4];
    if ((cVar23 == '+') || (cVar23 == '-')) {
      uVar9 = unit_string->_M_string_length;
      if (uVar9 <= sVar18 + 5) {
        multiplyRep(unit_string,sVar18,5);
        break;
      }
      cVar23 = pcVar19[sVar18 + 5];
      sz = 5;
    }
    else {
      uVar9 = unit_string->_M_string_length;
      sz = 4;
    }
    while ((sVar26 = sz + 1, (byte)(cVar23 - 0x30U) < 10 && (sz = sVar26, sVar18 + sVar26 < uVar9)))
    {
      cVar23 = pcVar19[sVar26 + sVar18];
    }
    multiplyRep(unit_string,sVar18,sz);
  }
  while (uVar9 = std::__cxx11::string::find((char *)unit_string,0x168837),
        uVar9 != 0xffffffffffffffff) {
    if ((unit_string->_M_string_length <= uVar9 + 2) ||
       (9 < (byte)((unit_string->_M_dataplus)._M_p[uVar9 + 2] - 0x30U))) {
      std::__cxx11::string::erase((ulong)unit_string,uVar9);
    }
  }
  while (sVar18 = std::__cxx11::string::find((char *)unit_string,0x16883a),
        sVar18 != 0xffffffffffffffff) {
    multiplyRep(unit_string,sVar18,4);
  }
  if (unit_string->_M_string_length == 0) {
    std::__cxx11::string::push_back(cVar31);
    return true;
  }
LAB_001504ec:
  while ((unit_string->_M_string_length != 0 &&
         (((bVar5 = *(unit_string->_M_dataplus)._M_p, bVar5 - 0x29 < 2 || (bVar5 == 0x7d)) ||
          (bVar5 == 0x5d))))) {
    std::__cxx11::string::erase((ulong)unit_string,0);
    if (unit_string->_M_string_length == 0) {
      return true;
    }
    uVar10 = CONCAT71((int7)(uVar10 >> 8),1);
    if (*(unit_string->_M_dataplus)._M_p == '(') {
      removeOuterParenthesis(unit_string);
    }
  }
  local_5b0 = CONCAT44(local_5b0._4_4_,(int)uVar10);
LAB_00150554:
  do {
    uVar10 = std::__cxx11::string::find_first_of((char *)unit_string,0x16865a);
    if ((local_598 <= uVar10) || (unit_string->_M_string_length - 1 <= uVar10)) goto LAB_0015063b;
    pcVar19 = (unit_string->_M_dataplus)._M_p;
    bVar5 = pcVar19[uVar10 + 1];
  } while (((bVar5 - 0x29 < 0x36) &&
           ((0x30000000200043U >> ((ulong)(bVar5 - 0x29) & 0x3f) & 1) != 0)) || (bVar5 == 0x7d));
  if (bVar5 == 0x7b) {
    if (pcVar19[uVar10] != '}') goto LAB_00150554;
  }
  else if (bVar5 == 0x6f) {
    if (((unit_string->_M_string_length <= uVar10 + 3) || (pcVar19[uVar10 + 2] != 'f')) ||
       ((cVar23 = pcVar19[uVar10 + 3], cVar23 == ')' || ((cVar23 == '}' || (cVar23 == ']')))))) {
      std::__cxx11::string::insert((ulong)unit_string,uVar10 + 1,'\x01');
    }
    goto LAB_00150554;
  }
  if (pcVar19[uVar10 - 1] != '\\') {
    std::__cxx11::string::insert((ulong)unit_string,uVar10 + 1,'\x01');
  }
  goto LAB_00150554;
LAB_0014f5e5:
  if ((cleanSpaces(std::__cxx11::string&,bool)::spaceChars_abi_cxx11_ == '\0') &&
     (iVar7 = __cxa_guard_acquire(&cleanSpaces(std::__cxx11::string&,bool)::spaceChars_abi_cxx11_),
     iVar7 != 0)) {
    std::__cxx11::string::string((string *)&str," \t\n\r",&local_5b5);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   cleanSpaces(std::__cxx11::string&,bool)::spaceChars_abi_cxx11_,&str,'\0');
    std::__cxx11::string::~string((string *)&str);
    __cxa_atexit(std::__cxx11::string::~string,
                 cleanSpaces(std::__cxx11::string&,bool)::spaceChars_abi_cxx11_,&__dso_handle);
    __cxa_guard_release(&cleanSpaces(std::__cxx11::string&,bool)::spaceChars_abi_cxx11_);
  }
  std::__cxx11::string::string((string *)&str,"square ",&local_5b5);
  bVar36 = isolatePriorModifier(unit_string,&str,'d','D');
  std::__cxx11::string::~string((string *)&str);
  std::__cxx11::string::string((string *)&str,"cubic ",&local_5b5);
  bVar5 = isolatePriorModifier(unit_string,&str,'_','-');
  local_598 = uVar10;
  std::__cxx11::string::~string((string *)&str);
  std::__cxx11::string::string((string *)&str," squared",&local_5b5);
  uVar10 = std::__cxx11::string::find((string *)unit_string,(ulong)&str);
  bVar34 = 0;
  if (uVar10 != 0xffffffffffffffff) {
    std::__cxx11::string::find_last_not_of(cVar31,0x20);
    uVar9 = std::__cxx11::string::find_last_of((char *)unit_string,0x1687d6);
    bVar34 = 0;
    if ((uVar9 != 0) && (bVar34 = 0, uVar9 < unit_string->_M_string_length)) {
      pcVar19 = (unit_string->_M_dataplus)._M_p;
      if (pcVar19[uVar9] == ' ') {
        cVar23 = pcVar19[uVar9 + 1];
        bVar38 = true;
        bVar29 = bVar38;
        if ((cVar23 != '*') && (cVar23 != '/')) {
          bVar29 = pcVar19[uVar9 - 1] == '/' || pcVar19[uVar9 - 1] == '*';
        }
        bVar34 = (cVar23 == '*' || cVar23 == '/') | bVar29;
        bVar34 = cVar23 == ')' | bVar34 | bVar34;
        bVar29 = (bool)(cVar23 == '-' | bVar34 | bVar34);
        bVar37 = bVar38;
        if (!bVar29) {
          bVar37 = pcVar19[uVar9 - 1] == ')';
        }
        bVar37 = (bool)(bVar37 | bVar29);
        if (!bVar37) {
          bVar38 = pcVar19[uVar9 - 1] == '-';
        }
        if (!bVar38 && !bVar37) {
          uVar12 = std::__cxx11::string::rfind(cVar31,0x2f);
          if (uVar12 < uVar10) {
            local_590._M_current._0_1_ = bVar5;
            std::__cxx11::string::insert((ulong)unit_string,uVar12 + 1,'\x01');
            uVar10 = std::__cxx11::string::find(cVar31,0x2f);
            if (uVar10 == 0xffffffffffffffff) {
              std::__cxx11::string::push_back(cVar31);
            }
            else {
              std::__cxx11::string::insert((ulong)unit_string,uVar10,'\x01');
            }
            bVar34 = 1;
            bVar5 = (byte)local_590._M_current;
            if (uVar10 <= uVar9) goto LAB_0014f77a;
            uVar9 = uVar9 + 1;
          }
          (unit_string->_M_dataplus)._M_p[uVar9] = '*';
          bVar34 = 1;
          goto LAB_0014f77a;
        }
      }
      bVar34 = 0;
    }
  }
LAB_0014f77a:
  bVar34 = bVar36 | bVar5 | bVar34;
  std::__cxx11::string::~string((string *)&str);
  uVar10 = local_5b0 & 0xffffffff;
  uVar9 = (ulong)local_5b4;
LAB_0014f79d:
  while( true ) {
    uVar12 = std::__cxx11::string::find_first_of((string *)unit_string,0x19fce0);
    uVar6 = (uint)uVar9;
    if (uVar12 != 0) break;
LAB_0014f7e0:
    std::__cxx11::string::erase((ulong)unit_string,uVar12);
    bVar34 = 1;
    uVar9 = (ulong)uVar6;
    uVar10 = local_5b0 & 0xffffffff;
  }
  if (uVar12 == 0xffffffffffffffff) goto LAB_0014fac8;
  if ((uVar9 & 1) != 0) {
LAB_0014f7c3:
    uVar6 = (uint)CONCAT71((int7)(uVar10 >> 8),1);
    if ((unit_string->_M_dataplus)._M_p[uVar12 - 1] != '.') goto LAB_0014f7e0;
    bVar34 = 1;
    uVar10 = local_5b0 & 0xffffffff;
    goto LAB_0014f79d;
  }
  __it = cleanSpaces(std::__cxx11::string&,bool)::spaceChars_abi_cxx11_;
  uVar27 = std::__cxx11::string::find_first_not_of((string *)unit_string,0x19fce0);
  if (uVar27 != 0xffffffffffffffff) {
    if (uVar12 != 1) goto LAB_0014f893;
    pcVar19 = (unit_string->_M_dataplus)._M_p;
    if (((byte)pcVar19[uVar27] - 0x2a < 0x35) &&
       ((0x10000000400021U >> ((ulong)((byte)pcVar19[uVar27] - 0x2a) & 0x3f) & 1) != 0)) {
      uVar12 = 1;
LAB_0014f8b9:
      std::__cxx11::string::erase((ulong)unit_string,uVar12);
LAB_0014f8be:
      bVar34 = 1;
      uVar9 = 0;
    }
    else if (unit_string->_M_string_length < 8) {
LAB_0014f851:
      pcVar19[1] = '*';
      bVar34 = 1;
      uVar9 = CONCAT71((int7)(uVar9 >> 8),1);
    }
    else {
      __it = (char *)0x2a;
      lVar30 = std::__cxx11::string::find(cVar31,0x2a);
      if (lVar30 == -1) {
        __it = "/^";
        uVar13 = std::__cxx11::string::find_first_of((char *)unit_string,0x168344);
        if (uVar13 < 9) {
          pcVar19 = (unit_string->_M_dataplus)._M_p;
          goto LAB_0014f851;
        }
      }
LAB_0014f893:
      this = (_Iter_negate<units::cleanSpaces(std::__cxx11::string&,bool)::__0> *)
             (unit_string->_M_dataplus)._M_p;
      _Var2 = this[uVar12 - 1];
      local_590._M_current = (char *)this;
      if (_Var2 == (_Iter_negate<units::cleanSpaces(std::__cxx11::string&,bool)::__0>)0x2f)
      goto LAB_0014f8b9;
      if (_Var2 == (_Iter_negate<units::cleanSpaces(std::__cxx11::string&,bool)::__0>)0x2e)
      goto LAB_0014f8be;
      if ((_Var2 == (_Iter_negate<units::cleanSpaces(std::__cxx11::string&,bool)::__0>)0x2a) ||
         ((uVar27 < unit_string->_M_string_length &&
          ((this[uVar27] == (_Iter_negate<units::cleanSpaces(std::__cxx11::string&,bool)::__0>)0x2f
           || (this[uVar27] ==
               (_Iter_negate<units::cleanSpaces(std::__cxx11::string&,bool)::__0>)0x2a))))))
      goto LAB_0014f8b9;
      local_588._M_current = (char *)(this + uVar12);
      uVar27 = uVar12;
      local_5b4 = uVar6;
      for (lVar30 = (long)uVar12 >> 2; uVar13 = local_5b0, _Var35._M_current = (char *)this,
          0 < lVar30; lVar30 = lVar30 + -1) {
        bVar36 = __gnu_cxx::__ops::_Iter_negate<units::cleanSpaces(std::__cxx11::string&,bool)::$_0>
                 ::operator()(this,(__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                    )__it);
        if (bVar36) {
LAB_0014f9a5:
          uVar9 = (ulong)local_5b4;
          uVar13 = local_5b0;
          goto LAB_0014f9ae;
        }
        bVar36 = __gnu_cxx::__ops::_Iter_negate<units::cleanSpaces(std::__cxx11::string&,bool)::$_0>
                 ::operator()(this + 1,(__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                        )__it);
        _Var35._M_current = (char *)(this + 1);
        if (bVar36) goto LAB_0014f9a5;
        bVar36 = __gnu_cxx::__ops::_Iter_negate<units::cleanSpaces(std::__cxx11::string&,bool)::$_0>
                 ::operator()(this + 2,(__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                        )__it);
        _Var35._M_current = (char *)(this + 2);
        if (bVar36) goto LAB_0014f9a5;
        bVar36 = __gnu_cxx::__ops::_Iter_negate<units::cleanSpaces(std::__cxx11::string&,bool)::$_0>
                 ::operator()(this + 3,(__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                        )__it);
        _Var35._M_current = (char *)(this + 3);
        if (bVar36) goto LAB_0014f9a5;
        this = this + 4;
        uVar27 = uVar27 - 4;
      }
      uVar9 = (ulong)local_5b4;
      if (uVar27 == 1) {
LAB_0014fa48:
        _Var3._M_current = local_588._M_current;
        bVar36 = __gnu_cxx::__ops::_Iter_negate<units::cleanSpaces(std::__cxx11::string&,bool)::$_0>
                 ::operator()(this,(__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                    )__it);
        _Var35._M_current = (char *)this;
        if (!bVar36) {
          _Var35._M_current = _Var3._M_current;
        }
LAB_0014f9ae:
        uVar10 = uVar13 & 0xffffffff;
        if (_Var35._M_current == local_588._M_current) goto LAB_0014fa19;
        str._M_dataplus._M_p._0_1_ = 0x2f;
        dVar14 = std::
                 __count_if<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__ops::_Iter_equals_val<char_const>>
                           (local_590,local_588,(_Iter_equals_val<const_char>)&str);
        if (((dVar14 != 1) ||
            (lVar30 = std::__cxx11::string::rfind((char *)unit_string,0x1687c4), lVar30 != -1)) ||
           (lVar30 = std::__cxx11::string::rfind((char *)unit_string,0x1687c8), lVar30 != -1)) {
LAB_0014fa09:
          if (uVar12 == 0) {
            uVar6 = 0;
            goto LAB_0014f7e0;
          }
          goto LAB_0014f7c3;
        }
        lVar30 = std::__cxx11::string::find_first_not_of((string *)unit_string,0x19fce0);
        lVar15 = std::__cxx11::string::find_first_of((char *)unit_string,0x1687cc);
        if (((lVar30 == -1) || (lVar15 == lVar30)) ||
           (pcVar19 = (unit_string->_M_dataplus)._M_p, (byte)(pcVar19[uVar12 - 1] - 0x30U) < 10))
        goto LAB_0014fa09;
        pcVar19[uVar12] = '*';
      }
      else {
        if (uVar27 == 2) {
LAB_0014fa33:
          bVar36 = __gnu_cxx::__ops::
                   _Iter_negate<units::cleanSpaces(std::__cxx11::string&,bool)::$_0>::operator()
                             (this,(__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                    )__it);
          _Var35._M_current = (char *)this;
          if (!bVar36) {
            this = this + 1;
            goto LAB_0014fa48;
          }
          goto LAB_0014f9ae;
        }
        uVar10 = local_5b0 & 0xffffffff;
        if (uVar27 == 3) {
          __it = local_588._M_current;
          bVar36 = __gnu_cxx::__ops::
                   _Iter_negate<units::cleanSpaces(std::__cxx11::string&,bool)::$_0>::operator()
                             (this,local_588);
          if (!bVar36) {
            this = this + 1;
            goto LAB_0014fa33;
          }
          goto LAB_0014f9ae;
        }
LAB_0014fa19:
        *local_588._M_current = '*';
      }
      bVar34 = 1;
      uVar9 = CONCAT71((int7)(uVar9 >> 8),1);
    }
    goto LAB_0014f79d;
  }
  std::__cxx11::string::erase((ulong)unit_string,uVar12);
  bVar34 = 1;
LAB_0014fac8:
  if (unit_string->_M_string_length == 0) {
    return true;
  }
  uVar10 = CONCAT71((int7)(uVar10 >> 8),(byte)uVar10 | bVar34);
LAB_0014fad6:
  uVar9 = std::__cxx11::string::find((char *)unit_string,0x1687da);
  while (match_flags = local_5a8, uVar9 != 0xffffffffffffffff) {
    if (uVar9 + 3 < unit_string->_M_string_length) {
      pcVar19 = (unit_string->_M_dataplus)._M_p;
      bVar5 = pcVar19[uVar9 + 3];
      if ((((byte)(bVar5 - 0x30) < 10) ||
          ((bVar5 < 0x2f && ((0x680000000000U >> ((ulong)(uint)bVar5 & 0x3f) & 1) != 0)))) &&
         ((uVar9 == 0 ||
          ((bVar5 = pcVar19[uVar9 - 1], 9 < (byte)(bVar5 - 0x30) &&
           (((0x3a < bVar5 - 0x2b ||
             ((0x40000000400000dU >> ((ulong)(bVar5 - 0x2b) & 0x3f) & 1) == 0)) ||
            ((uVar9 != 1 && ((bVar5 == 0x2e && ((byte)(pcVar19[uVar9 - 2] - 0x3aU) < 0xf6)))))))))))
         ) {
        std::__cxx11::string::substr((ulong)&str,(ulong)unit_string);
        if ((str._M_string_length != 0) &&
           (uVar12 = (ulong)((*str._M_dataplus._M_p - 0x2bU & 0xfd) == 0),
           (byte)(str._M_dataplus._M_p[uVar12] - 0x30U) < 10)) {
          uVar12 = uVar12 + 1;
          do {
            if (str._M_string_length <= uVar12) goto LAB_0014fc14;
            pbVar1 = (byte *)(str._M_dataplus._M_p + uVar12);
            uVar12 = uVar12 + 1;
          } while ((byte)(*pbVar1 - 0x30) < 10);
          uVar6 = *pbVar1 - 0x2e;
          if ((((0x37 < uVar6) || ((0x80000000800001U >> ((ulong)uVar6 & 0x3f) & 1) == 0)) ||
              (str._M_string_length <= uVar12)) ||
             ((9 < (byte)(str._M_dataplus._M_p[uVar12] - 0x30U) &&
              ((str._M_dataplus._M_p[uVar12] - 0x2bU & 0xfd) != 0)))) {
LAB_0014fc14:
            uVar8 = std::__cxx11::stoi(&str,(size_t *)0x0,10);
            uVar6 = -uVar8;
            if (0 < (int)uVar8) {
              uVar6 = uVar8;
            }
            if (uVar6 < 0x27) {
              std::__cxx11::string::replace((ulong)unit_string,uVar9,(char *)0x3);
            }
          }
        }
        std::__cxx11::string::~string((string *)&str);
      }
    }
    uVar9 = std::__cxx11::string::find((char *)unit_string,0x1687da);
  }
  goto LAB_0014fc83;
LAB_0014fe78:
  uVar10 = std::__cxx11::string::find((char *)unit_string,0x168815);
  if (uVar10 != 0xffffffffffffffff) {
    pcStackY_5d0 = (char *)0x8;
LAB_0014fe94:
    std::__cxx11::string::replace((ulong)unit_string,uVar10,pcStackY_5d0);
  }
  goto LAB_0014fe37;
LAB_0014febf:
  uVar10 = std::__cxx11::string::find((char *)unit_string,0x16881d);
  if (uVar10 != 0xffffffffffffffff) {
    std::__cxx11::string::replace((ulong)unit_string,uVar10,(char *)0x5);
    uVar10 = std::__cxx11::string::find((char *)unit_string,0x168823);
    if (uVar10 == 0xffffffffffffffff) goto LAB_0014ff00;
    pcStackY_5d0 = (char *)0x6;
    goto LAB_0014ff1c;
  }
  goto LAB_0014ff27;
LAB_0014ff00:
  uVar10 = std::__cxx11::string::find((char *)unit_string,0x16882a);
  if (uVar10 != 0xffffffffffffffff) {
    pcStackY_5d0 = (char *)0x8;
LAB_0014ff1c:
    std::__cxx11::string::replace((ulong)unit_string,uVar10,pcStackY_5d0);
  }
  goto LAB_0014febf;
LAB_0015063b:
  uVar10 = std::__cxx11::string::find(cVar31,0x5e);
  sVar25 = unit_string->_M_string_length;
  uVar6 = (uint)local_5b0;
  if ((local_598 <= uVar10) || (sVar25 - 3 <= uVar10)) {
    if (sVar25 != 0) {
LAB_001506d2:
      pcVar17 = (unit_string->_M_dataplus)._M_p;
      if (*pcVar17 == '/') {
        std::__cxx11::string::insert(unit_string,pcVar17,0x31);
        uVar6 = 1;
      }
    }
    if ((local_5a8 >> 0x24 & 1) == 0) {
      pcVar19 = (pointer)std::__cxx11::string::find(cVar31,0x7b);
      while (pcVar33 = pcVar19, pcVar33 != (pointer)0xffffffffffffffff) {
        str._M_dataplus._M_p = pcVar33 + 1;
        bVar36 = segmentcheck(unit_string,'}',(size_t *)&str);
        pcVar19 = (pointer)0xffffffffffffffff;
        if (bVar36) {
          pcVar19 = (unit_string->_M_dataplus)._M_p;
          pcVar28 = str._M_dataplus._M_p + -2;
          for (; pcVar28 != pcVar33; pcVar33 = pcVar33 + 1) {
            iVar7 = tolower((int)pcVar33[(long)(pcVar19 + 1)]);
            pcVar33[(long)(pcVar19 + 1)] = (char)iVar7;
          }
          pcVar19 = (pointer)std::__cxx11::string::find(cVar31,0x7b);
        }
      }
    }
    if ((uVar6 & 1) == 0) {
      return unit_string->_M_string_length != local_578;
    }
    return true;
  }
  pcVar19 = (unit_string->_M_dataplus)._M_p;
  uVar9 = uVar10 + 1;
  if (pcVar19[uVar10 + 1] != '-') {
    uVar9 = uVar10;
  }
  if (uVar9 < sVar25 - 3) {
    for (uVar10 = 1;
        (uVar12 = uVar10 + uVar9, 0xf5 < (byte)(pcVar19[uVar10 + uVar9] - 0x3aU) &&
        (uVar12 <= sVar25 - 1)); uVar10 = uVar10 + 1) {
    }
    if (sVar25 - 1 < uVar12) goto LAB_001506d2;
    if (1 < uVar10) {
      uVar6 = (byte)pcVar19[uVar10 + uVar9] - 0x2a;
      if (((0x3b < uVar6) || ((0x810000008000021U >> ((ulong)uVar6 & 0x3f) & 1) == 0)) &&
         (pcVar19[uVar10 + uVar9] != 0)) {
        std::__cxx11::string::insert((ulong)unit_string,uVar12,'\x01');
      }
    }
  }
  goto LAB_0015063b;
}

Assistant:

static bool cleanUnitString(std::string& unit_string, std::uint64_t match_flags)
{
    auto slen = unit_string.size();
    bool skipcodereplacement = ((match_flags & skip_code_replacements) != 0);
    static UNITS_CPP14_CONSTEXPR_OBJECT std::array<ckpair, 4>
        earlyCodeReplacements{{
            ckpair{"degree", "deg"},
            ckpair{"Degree", "deg"},
            ckpair{"degs ", "deg"},
            ckpair{"deg ", "deg"},
        }};

    static UNITS_CPP14_CONSTEXPR_OBJECT std::array<ckpair, 37>
        allCodeReplacements{{
            ckpair{"sq.", "square"},
            ckpair{"cu.", "cubic"},
            ckpair{"U.S.A.", "US"},
            ckpair{"U.S.", "US"},
            ckpair{"10^", "1e"},
            ckpair{"10-", "1e-"},
            ckpair{"^+", "^"},
            ckpair{"'s", "s"},
            ckpair{"ampere", "amp"},
            ckpair{"Ampere", "amp"},
            ckpair{"metre", "meter"},
            ckpair{"Metre", "meter"},
            ckpair{"litre", "liter"},
            ckpair{"Litre", "liter"},
            ckpair{"B.Th.U.", "BTU"},
            ckpair{"B.T.U.", "BTU"},
            ckpair{"Britishthermalunits", "BTU"},
            ckpair{"Britishthermalunitat", "BTU"},
            ckpair{"Britishthermalunit", "BTU"},
            ckpair{"BritishThermalUnits", "BTU"},
            ckpair{"BritishThermalUnitAt", "BTU"},
            ckpair{"BritishThermalUnit", "BTU"},
            ckpair{"BThU", "BTU"},
            ckpair{"-US", "US"},
            ckpair{"--", "*"},
            // -- is either a double negative or a separator, so make it a
            // multiplier so it doesn't get erased and then converted to a
            // power
            ckpair{"\\\\", "\\\\*"},
            // \\ is always considered a segment terminator so it won't be
            // misinterpreted as a known escape sequence
            ckpair{"perunit", "pu"},
            ckpair{"percent", "%"},
            ckpair{"per-unit", "pu"},
            ckpair{"per unit ", "pu"},
            ckpair{"/square*", "/square"},
            ckpair{"/cubic*", "/cubic"},
            ckpair{"Hz^0.5", "rootHertz"},
            ckpair{"Hz^.5", "rootHertz"},
            ckpair{"Hz^(1/2)", "rootHertz"},
            ckpair{"Hz^1/2", "rootHertz"},
            ckpair{u8"\u221AHz", "rootHertz"},
        }};

    static const std::string spchar = std::string(" \t\n\r") + '\0';
    bool changed = false;
    bool skipMultiply = false;
    std::size_t skipMultiplyInsertionAfter{std::string::npos};
    char tail = unit_string.back();
    if (tail == '^' || tail == '*' || tail == '/') {
        unit_string.pop_back();
        changed = true;
    }
    auto c = unit_string.find_first_not_of(spchar);
    if (c == std::string::npos) {
        unit_string.clear();
        return true;
    }
    if (c != 0) {
        unit_string.erase(0, c);
        c = unit_string.find_first_not_of(spchar);
        changed = true;
    }
    if (unit_string[c] == '/') {
        unit_string.insert(c, 1, '1');
        changed = true;
        skipMultiply = true;
    }
    if (!skipcodereplacement) {
        // Check for unicode or extended characters
        if (std::any_of(unit_string.begin(), unit_string.end(), [](char x) {
                return (static_cast<std::uint8_t>(x) & 0x80U) != 0;
            })) {
            if (unicodeReplacement(unit_string)) {
                changed = true;
            }
        }

        // some code replacement that needs to be done before single character
        // and space replacements
        for (const auto& acode : earlyCodeReplacements) {
            auto fnd = unit_string.find(acode.first);
            while (fnd != std::string::npos) {
                changed = true;
                unit_string.replace(fnd, strlen(acode.first), acode.second);
                fnd = unit_string.find(acode.first, fnd + 1);
            }
        }

        if (unit_string.find_first_of(spchar) != std::string::npos) {
            // deal with some particular string with a space in them
            std::size_t reploc{0};
            // clean up some "per" words
            if (unit_string.compare(0, 4, "per ") == 0) {
                reploc = 2;
                unit_string.replace(0, 4, "1/");
                skipMultiply = true;
            }
            if (ReplaceStringInPlace(unit_string, " per ", 5, "/", 1, reploc)) {
                skipMultiply = true;
            }
            if (reploc > 0) {
                auto ploc = unit_string.find_first_of('(', reploc);
                if (ploc != std::string::npos) {
                    auto fdiv = unit_string.find_first_of('/', reploc);
                    std::size_t ndiv{0};
                    do {
                        ndiv = unit_string.find_first_of('/', fdiv + 1);
                        if (ploc < ndiv) {
                            if (ndiv != std::string::npos) {
                                unit_string.insert(ndiv, 1, ')');
                            } else {
                                unit_string.push_back(')');
                            }
                            unit_string.insert(fdiv + 1, 1, '(');
                            fdiv = ndiv + 2;
                        } else {
                            fdiv = ndiv;
                        }
                    } while (ndiv != std::string::npos);
                }
            }
            checkShortUnits(unit_string, match_flags);
            auto fndP = unit_string.find(" of ");
            while (fndP != std::string::npos) {
                auto nchar = unit_string.find_first_not_of(spchar, fndP + 4);
                if (nchar != std::string::npos) {
                    if (unit_string[nchar] == '(' ||
                        unit_string[nchar] == '[') {
                        skipMultiplyInsertionAfter = fndP;
                        break;
                    }
                }
                fndP = unit_string.find(" of ", fndP + 3);
            }
            changed |= cleanSpaces(unit_string, skipMultiply);
            if (unit_string.empty()) {
                // LCOV_EXCL_START
                return true;
                // LCOV_EXCL_STOP
            }
        }

        checkPowerOf10(unit_string);
    } else {
        auto fndP = unit_string.find("of(");
        if (fndP != std::string::npos) {
            skipMultiplyInsertionAfter = fndP;
        }
    }
    if (unit_string.front() == '(') {
        removeOuterParenthesis(unit_string);
        if (unit_string.empty()) {
            return true;
        }
    }

    if (!skipcodereplacement) {
        // ** means power in some environments
        std::size_t loc{0};
        if (ReplaceStringInPlace(unit_string, "**", 2, "^", 1, loc)) {
            changed = true;
        }
    }
    if ((match_flags & case_insensitive) != 0) {
        ciConversion(unit_string);
        changed = true;
    }
    if (!skipcodereplacement) {
        // deal with some html stuff
        auto bloc = unit_string.find_last_of('<');
        if (bloc != std::string::npos) {
            htmlCodeReplacement(unit_string);
        }
        // some abbreviations and other problematic code replacements
        for (const auto& acode : allCodeReplacements) {
            auto fnd = unit_string.find(acode.first);
            while (fnd != std::string::npos) {
                changed = true;
                unit_string.replace(fnd, strlen(acode.first), acode.second);
                fnd = unit_string.find(acode.first, fnd + 1);
            }
        }
    }
    if (unit_string.size() >= 2) {
        auto eit = unit_string.end() - 1;
        if (*(eit) == '2' || *(eit) == '3') {
            if ((*(eit - 1) == '-' || *(eit - 1) == '+') &&
                unit_string.size() >= 3) {
                --eit;
            }
            if (!isDigitCharacter(*(eit - 1))) {
                switch (*(eit - 1)) {
                    case '^':
                    case 'e':
                    case 'E':
                    case '/':
                    case '+':
                    case '-':
                    case '.':
                        break;
                    case '*':
                        *(eit - 1) = '^';
                        break;
                    default:
                        if (eit[0] != '+') {
                            unit_string.insert(eit, '^');
                        } else {
                            *eit = '^';
                        }

                        break;
                }
            }
        }
    }
    if (!skipcodereplacement) {
        // handle dot notation for multiplication
        auto dotloc = unit_string.find_last_of('.');
        if (dotloc < std::string::npos) {
            // strings always have a null pointer at the end
            if (!isDigitCharacter(unit_string[dotloc + 1])) {
                cleanDotNotation(unit_string, match_flags);
                changed = true;
            }
        }

        // clear empty parenthesis
        auto fndP = unit_string.find("()");
        while (fndP != std::string::npos) {
            if (unit_string.size() > fndP + 2) {
                if (unit_string[fndP + 2] == '^') {
                    unit_string.replace(fndP, 2, "*1");
                } else {
                    unit_string.erase(fndP, 2);
                }
            } else {
                unit_string.erase(fndP, 2);
            }
            fndP = unit_string.find("()", fndP);
        }
        // clear empty brackets, this would indicate commodities but if
        // empty there is no commodity
        clearEmptySegments(unit_string);
        cleanUpPowersOfOne(unit_string);
        if (unit_string.empty()) {
            unit_string.push_back('1');
            return true;
        }
    }
    // remove leading *})],  equivalent of 1* but we don't need to process
    // that further
    while (!unit_string.empty() &&
           (unit_string.front() == '*' || unit_string.front() == '}' ||
            unit_string.front() == ')' || unit_string.front() == ']')) {
        unit_string.erase(0, 1);
        changed = true;
        if (unit_string.empty()) {
            return true;
        }
        // check for parenthesis again
        if (unit_string.front() == '(') {
            removeOuterParenthesis(unit_string);
        }
    }
    // inject multiplies after bracket terminators
    auto fnd = unit_string.find_first_of(")]}");
    while (fnd < unit_string.size() - 1 && fnd < skipMultiplyInsertionAfter) {
        switch (unit_string[fnd + 1]) {
            case '^':
            case '*':
            case '/':
            case ')':
            case ']':
            case '}':
            case '>':
                fnd = unit_string.find_first_of(")]}", fnd + 1);
                break;
            case 'o':  // handle special case of commodity modifier using
                       // "of"
                if (unit_string.size() > fnd + 3) {
                    auto tc2 = unit_string[fnd + 3];
                    if (unit_string[fnd + 2] == 'f' && tc2 != ')' &&
                        tc2 != ']' && tc2 != '}') {
                        fnd = unit_string.find_first_of(")]}", fnd + 3);
                        break;
                    }
                }
                unit_string.insert(fnd + 1, 1, '*');
                fnd = unit_string.find_first_of(")]}", fnd + 3);
                break;
            case '{':
                if (unit_string[fnd] != '}') {
                    fnd = unit_string.find_first_of(")]}", fnd + 1);
                    break;
                }
                /* FALLTHRU */
            default:
                if (unit_string[fnd - 1] == '\\') {  // ignore escape sequences
                    fnd = unit_string.find_first_of(")]}", fnd + 1);
                    break;
                }
                unit_string.insert(fnd + 1, 1, '*');
                fnd = unit_string.find_first_of(")]}", fnd + 2);
                break;
        }
    }
    // insert multiplies after ^#
    fnd = unit_string.find_first_of('^');
    while (fnd < unit_string.size() - 3 && fnd < skipMultiplyInsertionAfter) {
        if (unit_string[fnd + 1] == '-') {
            ++fnd;
        }
        if (fnd < unit_string.size() - 3) {
            std::size_t seq = 1;
            auto p = unit_string[fnd + seq];
            while (p >= '0' && p <= '9' &&
                   fnd + seq <= unit_string.size() - 1U) {
                ++seq;
                p = unit_string[fnd + seq];
            }
            if (fnd + seq > unit_string.size() - 1U) {
                break;
            }
            if (seq > 1) {
                auto c2 = unit_string[fnd + seq];
                if (c2 != '\0' && c2 != '*' && c2 != '/' && c2 != '^' &&
                    c2 != 'e' && c2 != 'E') {
                    unit_string.insert(fnd + seq, 1, '*');
                }
            }
        }
        fnd = unit_string.find_first_of('^', fnd + 2);
    }

    // this still might occur from code replacements or other removal
    if (!unit_string.empty() && unit_string.front() == '/') {
        unit_string.insert(unit_string.begin(), '1');
        changed = true;
    }
    if (!skipcodereplacement) {  // make everything inside {} lower case
        auto bloc = unit_string.find_first_of('{');
        while (bloc != std::string::npos) {
            auto ind = bloc + 1;
            if (segmentcheck(unit_string, '}', ind)) {
                std::transform(
                    unit_string.begin() + bloc + 1,
                    unit_string.begin() + ind - 1,
                    unit_string.begin() + bloc + 1,
                    ::tolower);
                bloc = unit_string.find_first_of('{', ind);
            } else {
                bloc = std::string::npos;
            }
        }
    }
    return (changed || unit_string.size() != slen);
}